

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O1

long duckdb::DateSubFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  long in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  allocator_type local_551;
  long local_550;
  code *local_548;
  undefined8 uStack_540;
  code *local_538;
  code *pcStack_530;
  code *local_528;
  undefined8 uStack_520;
  code *local_518;
  code *pcStack_510;
  code *local_508;
  undefined8 uStack_500;
  code *local_4f8;
  code *pcStack_4f0;
  LogicalType local_4e8 [24];
  LogicalType local_4d0 [24];
  LogicalType local_4b8 [24];
  LogicalType local_4a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_488;
  LogicalType local_470 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_458;
  LogicalType local_440 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_428;
  LogicalType local_410 [24];
  LogicalType local_3f8 [24];
  LogicalType local_3e0 [24];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"date_sub","");
  local_550 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0]);
  }
  duckdb::LogicalType::LogicalType(local_4e8,VARCHAR);
  duckdb::LogicalType::LogicalType(local_4d0,DATE);
  duckdb::LogicalType::LogicalType(local_4b8,DATE);
  __l._M_len = 3;
  __l._M_array = local_4e8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_428,__l,&local_551);
  duckdb::LogicalType::LogicalType(local_440,BIGINT);
  uStack_500 = 0;
  local_508 = DateSubFunction<duckdb::date_t>;
  pcStack_4f0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_4f8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_3e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_428,local_440,&local_508,0,0,0,0,local_3e0,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
         (local_550 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_158 + 0xb0U),(_Any_data *)((long)&local_158 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_3e0);
  if (local_4f8 != (code *)0x0) {
    (*local_4f8)(&local_508,&local_508,3);
  }
  duckdb::LogicalType::~LogicalType(local_440);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_428);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_4e8 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::LogicalType(local_4e8,VARCHAR);
  duckdb::LogicalType::LogicalType(local_4d0,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_4b8,TIMESTAMP);
  __l_00._M_len = 3;
  __l_00._M_array = local_4e8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_458,__l_00,&local_551);
  duckdb::LogicalType::LogicalType(local_470,BIGINT);
  uStack_520 = 0;
  local_528 = DateSubFunction<duckdb::timestamp_t>;
  pcStack_510 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_518 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_3f8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_458,local_470,&local_528,0,0,0,0,local_3f8,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  local_280._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_280 + 0xb0U),(_Any_data *)((long)&local_280 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_3f8);
  if (local_518 != (code *)0x0) {
    (*local_518)(&local_528,&local_528,3);
  }
  duckdb::LogicalType::~LogicalType(local_470);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_458);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_4e8 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::LogicalType(local_4e8,VARCHAR);
  duckdb::LogicalType::LogicalType(local_4d0,TIME);
  duckdb::LogicalType::LogicalType(local_4b8,TIME);
  __l_01._M_len = 3;
  __l_01._M_array = local_4e8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_488,__l_01,&local_551);
  duckdb::LogicalType::LogicalType(local_4a0,BIGINT);
  uStack_540 = 0;
  local_548 = DateSubFunction<duckdb::dtime_t>;
  pcStack_530 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_538 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_410,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a8,&local_488,local_4a0,&local_548,0,0,0,0,local_410,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a8);
  local_3a8._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_3a8 + 0xb0U),(_Any_data *)((long)&local_3a8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_410);
  if (local_538 != (code *)0x0) {
    (*local_538)(&local_548,&local_548,3);
  }
  duckdb::LogicalType::~LogicalType(local_4a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_488);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_4e8 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return local_550;
}

Assistant:

ScalarFunctionSet DateSubFun::GetFunctions() {
	ScalarFunctionSet date_sub("date_sub");
	date_sub.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::DATE, LogicalType::DATE},
	                                    LogicalType::BIGINT, DateSubFunction<date_t>));
	date_sub.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIMESTAMP, LogicalType::TIMESTAMP},
	                                    LogicalType::BIGINT, DateSubFunction<timestamp_t>));
	date_sub.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::TIME, LogicalType::TIME},
	                                    LogicalType::BIGINT, DateSubFunction<dtime_t>));
	return date_sub;
}